

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_errors.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::errors<char[38],char[9],char[4],char[7],char[94]>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char (*args) [38],char (*args_1) [9],
          char (*args_2) [4],char (*args_3) [7],char (*args_4) [94])

{
  long *plVar1;
  long *plVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  size_type *psVar4;
  long *plVar5;
  long lVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_211;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190 [2];
  long local_180 [2];
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_150 [2];
  undefined1 local_140 [16];
  pointer local_130 [2];
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_150[0] = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_140;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_150,"scoped<.*>::is_not_convertible_to<.*>","");
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_150,0,(char *)0x0,0x125f30);
  local_1b0 = &local_1a0;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_1a0 = *plVar2;
    lStack_198 = plVar1[3];
  }
  else {
    local_1a0 = *plVar2;
    local_1b0 = (long *)*plVar1;
  }
  local_1a8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar4 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_d0.field_2._M_allocated_capacity = *psVar4;
    local_d0.field_2._8_4_ = (undefined4)plVar1[3];
    local_d0.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar4;
    local_d0._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_d0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"instance","");
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x125f30);
  local_1d0 = &local_1c0;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_1c0 = *plVar2;
    lStack_1b8 = plVar1[3];
  }
  else {
    local_1c0 = *plVar2;
    local_1d0 = (long *)*plVar1;
  }
  local_1c8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  local_b0 = &local_a0;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_a0 = *plVar2;
    uStack_98 = (undefined4)plVar1[3];
    uStack_94 = *(undefined4 *)((long)plVar1 + 0x1c);
  }
  else {
    local_a0 = *plVar2;
    local_b0 = (long *)*plVar1;
  }
  local_a8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_110._M_allocated_capacity = (size_type)local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_120 + 0x10),"int","");
  plVar1 = (long *)std::__cxx11::string::replace((ulong)(local_120 + 0x10),0,(char *)0x0,0x125f30);
  local_1f0 = &local_1e0;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_1e0 = *plVar2;
    lStack_1d8 = plVar1[3];
  }
  else {
    local_1e0 = *plVar2;
    local_1f0 = (long *)*plVar1;
  }
  local_1e8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  local_90 = &local_80;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_80 = *plVar2;
    uStack_78 = (undefined4)plVar1[3];
    uStack_74 = *(undefined4 *)((long)plVar1 + 0x1c);
  }
  else {
    local_80 = *plVar2;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"int.*&","");
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_190,0,(char *)0x0,0x125f30);
  local_210 = &local_200;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_200 = *plVar2;
    lStack_1f8 = plVar1[3];
  }
  else {
    local_200 = *plVar2;
    local_210 = (long *)*plVar1;
  }
  local_208 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_210);
  local_70 = &local_60;
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    uStack_58 = (undefined4)plVar1[3];
    uStack_54 = *(undefined4 *)((long)plVar1 + 0x1c);
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_130[0] = (pointer)local_120;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_130,
             "instance is not convertible to the requested type, verify binding: \'di::bind<T>.to\\(value\\)\'?"
             ,"");
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_130,0,(char *)0x0,0x125f30);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_160 = *plVar2;
    lStack_158 = plVar1[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *plVar2;
    local_170 = (long *)*plVar1;
  }
  local_168 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_170);
  plVar1 = local_40;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_40[0] = *plVar5;
    local_40[1] = plVar2[3];
    local_50 = plVar1;
  }
  else {
    local_40[0] = *plVar5;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __l._M_len = 5;
  __l._M_array = &local_d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,&local_211);
  lVar6 = -0xa0;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    plVar1 = plVar1 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_130[0] != (pointer)local_120) {
    operator_delete(local_130[0],(ulong)(local_120._0_8_ + 1));
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200 + 1);
  }
  if (local_190[0] != local_180) {
    operator_delete(local_190[0],local_180[0] + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if ((long *)local_110._M_allocated_capacity != local_100) {
    operator_delete((void *)local_110._M_allocated_capacity,local_100[0] + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_140;
  if (local_150[0] != pvVar3) {
    operator_delete(local_150[0],(ulong)((long)&((_Alloc_hider *)local_140._0_8_)->_M_p + 1));
    pvVar3 = extraout_RAX;
  }
  return pvVar3;
}

Assistant:

auto errors(const TArgs&... args) {
  return std::vector<std::string>{(".*" + std::string{args} + ".*")...};
}